

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_types.cpp
# Opt level: O3

StatisticObject __thiscall Clasp::SolverStats::at(SolverStats *this,char *k)

{
  ExtendedStats *this_00;
  int iVar1;
  uint32 type;
  StatisticObject SVar2;
  StatisticObject local_20;
  
  this_00 = this->extra;
  if (this_00 != (ExtendedStats *)0x0) {
    iVar1 = strncmp(k,"extra",5);
    if (iVar1 == 0) {
      if (k[5] != '\0') {
        if (k[5] != '.') goto LAB_00173488;
        if (k[6] != '\0') {
          SVar2 = ExtendedStats::at(this_00,k + 6);
          return (StatisticObject)SVar2.handle_;
        }
      }
      type = StatisticObject::registerMap<Clasp::ExtendedStats>();
      StatisticObject::StatisticObject(&local_20,this_00,type);
      return (StatisticObject)local_20.handle_;
    }
  }
LAB_00173488:
  SVar2 = CoreStats::at(&this->super_CoreStats,k);
  return (StatisticObject)SVar2.handle_;
}

Assistant:

StatisticObject SolverStats::at(const char* k) const {
	if (extra && matchPath(k, "extra")) {
		return !*k ? StatisticObject::map(extra) : extra->at(k);
	}
	else {
		return CoreStats::at(k);
	}
}